

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::extend<2ul,int,double,(wasm::LaneOrder)0>
          (Literal *__return_storage_ptr__,wasm *this,Literal *vec)

{
  Literal *pLVar1;
  Literal *pLVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  Type *__return_storage_ptr___00;
  undefined1 local_e8 [8];
  LaneArray<2UL_*_2> lanes;
  LaneArray<2UL> result;
  anon_union_16_6_1532cd5a_for_Literal_0 local_50;
  undefined8 local_40;
  Literal *local_38;
  
  __return_storage_ptr___00 = (Type *)local_e8;
  local_38 = __return_storage_ptr__;
  getLanes<int,4>((LaneArray<4> *)__return_storage_ptr___00,this,vec);
  result._M_elems[1].field_0.i64 = 0;
  result._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[0].type.id = 0;
  lanes._M_elems[3].type.id = 0;
  result._M_elems[0].field_0.i64 = 0;
  bVar3 = true;
  pLVar1 = lanes._M_elems + 3;
  do {
    bVar4 = bVar3;
    if (__return_storage_ptr___00[2].id != 2) {
      __assert_fail("type == Type::i32",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x120,"int32_t wasm::Literal::geti32() const");
    }
    local_50.i64 = (int64_t)(double)(((Literal *)&__return_storage_ptr___00->id)->field_0).i32;
    local_40 = 5;
    Literal::~Literal((Literal *)&pLVar1->type);
    Literal::Literal((Literal *)&pLVar1->type,(Literal *)&local_50.func);
    Literal::~Literal((Literal *)&local_50.func);
    pLVar2 = local_38;
    __return_storage_ptr___00 = &lanes._M_elems[0].type;
    bVar3 = false;
    pLVar1 = result._M_elems;
  } while (bVar4);
  Literal::Literal(local_38,(LaneArray<2> *)&lanes._M_elems[3].type);
  lVar5 = 0x18;
  do {
    Literal::~Literal((Literal *)((long)&lanes._M_elems[3].type.id + lVar5));
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  lVar5 = 0x48;
  do {
    Literal::~Literal((Literal *)(local_e8 + lVar5));
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  return pLVar2;
}

Assistant:

Literal extend(const Literal& vec) {
  LaneArray<Lanes* 2> lanes = getLanes<LaneFrom, Lanes * 2>(vec);
  LaneArray<Lanes> result;
  for (size_t i = 0; i < Lanes; ++i) {
    size_t idx = (Side == LaneOrder::Low) ? i : i + Lanes;
    result[i] = Literal((LaneTo)(LaneFrom)lanes[idx].geti32());
  }
  return Literal(result);
}